

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O0

void chirc_ctx_add_connection(chirc_ctx_t *ctx,chirc_connection_t *conn)

{
  UT_hash_handle *pUVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  UT_hash_table *pUVar6;
  UT_hash_bucket *pUVar7;
  UT_hash_bucket *pUVar8;
  uint local_74;
  UT_hash_bucket *_he_newbkt;
  UT_hash_bucket *_he_new_buckets;
  UT_hash_handle *_he_hh_nxt;
  UT_hash_handle *_he_thh;
  uint _he_bkt_i;
  uint _he_bkt;
  UT_hash_bucket *_ha_head;
  int *piStack_30;
  uint _ha_bkt;
  uchar *_hj_key;
  uint _hj_k;
  uint _hj_j;
  uint _hj_i;
  uint _ha_hashv;
  chirc_connection_t *conn_local;
  chirc_ctx_t *ctx_local;
  
  piStack_30 = &conn->socket;
  _hj_j = 0xfeedbeef;
  _hj_key._4_4_ = 0x9e3779b9;
  _hj_k = 0x9e3779b9;
  for (_hj_key._0_4_ = 4; 0xb < (uint)_hj_key; _hj_key._0_4_ = (uint)_hj_key - 0xc) {
    iVar2 = (uint)*(byte *)(piStack_30 + 1) + (uint)*(byte *)((long)piStack_30 + 5) * 0x100 +
            (uint)*(byte *)((long)piStack_30 + 6) * 0x10000 +
            (uint)*(byte *)((long)piStack_30 + 7) * 0x1000000 + _hj_key._4_4_;
    uVar3 = (uint)*(byte *)&((UT_hash_handle *)(piStack_30 + 2))->tbl +
            (uint)*(byte *)((long)piStack_30 + 9) * 0x100 +
            (uint)*(byte *)((long)piStack_30 + 10) * 0x10000 +
            (uint)*(byte *)((long)piStack_30 + 0xb) * 0x1000000 + _hj_j;
    uVar4 = uVar3 >> 0xd ^
            (((uint)(byte)*piStack_30 + (uint)*(byte *)((long)piStack_30 + 1) * 0x100 +
              (uint)*(byte *)((long)piStack_30 + 2) * 0x10000 +
              (uint)*(byte *)((long)piStack_30 + 3) * 0x1000000 + _hj_k) - iVar2) - uVar3;
    uVar5 = uVar4 << 8 ^ (iVar2 - uVar3) - uVar4;
    uVar3 = uVar5 >> 0xd ^ (uVar3 - uVar4) - uVar5;
    uVar4 = uVar3 >> 0xc ^ (uVar4 - uVar5) - uVar3;
    uVar5 = uVar4 << 0x10 ^ (uVar5 - uVar3) - uVar4;
    uVar3 = uVar5 >> 5 ^ (uVar3 - uVar4) - uVar5;
    _hj_k = uVar3 >> 3 ^ (uVar4 - uVar5) - uVar3;
    _hj_key._4_4_ = _hj_k << 10 ^ (uVar5 - uVar3) - _hj_k;
    _hj_j = _hj_key._4_4_ >> 0xf ^ (uVar3 - _hj_k) - _hj_key._4_4_;
    piStack_30 = piStack_30 + 3;
  }
  uVar3 = _hj_j + 4;
  switch((uint)_hj_key) {
  case 8:
    _hj_key._4_4_ =
         (uint)*(byte *)(piStack_30 + 1) +
         (uint)*(byte *)((long)piStack_30 + 5) * 0x100 +
         (uint)*(byte *)((long)piStack_30 + 6) * 0x10000 +
         (uint)*(byte *)((long)piStack_30 + 7) * 0x1000000 + _hj_key._4_4_;
  case 4:
    _hj_k = (uint)(byte)*piStack_30 +
            (uint)*(byte *)((long)piStack_30 + 1) * 0x100 +
            (uint)*(byte *)((long)piStack_30 + 2) * 0x10000 +
            (uint)*(byte *)((long)piStack_30 + 3) * 0x1000000 + _hj_k;
  }
  uVar4 = uVar3 >> 0xd ^ (_hj_k - _hj_key._4_4_) - uVar3;
  uVar5 = uVar4 << 8 ^ (_hj_key._4_4_ - uVar3) - uVar4;
  uVar3 = uVar5 >> 0xd ^ (uVar3 - uVar4) - uVar5;
  uVar4 = uVar3 >> 0xc ^ (uVar4 - uVar5) - uVar3;
  uVar5 = uVar4 << 0x10 ^ (uVar5 - uVar3) - uVar4;
  uVar3 = uVar5 >> 5 ^ (uVar3 - uVar4) - uVar5;
  uVar4 = uVar3 >> 3 ^ (uVar4 - uVar5) - uVar3;
  uVar5 = uVar4 << 10 ^ (uVar5 - uVar3) - uVar4;
  uVar3 = uVar5 >> 0xf ^ (uVar3 - uVar4) - uVar5;
  (conn->hh).hashv = uVar3;
  (conn->hh).key = &conn->socket;
  (conn->hh).keylen = 4;
  if (ctx->connections == (chirc_connection_t *)0x0) {
    (conn->hh).next = (void *)0x0;
    (conn->hh).prev = (void *)0x0;
    pUVar6 = (UT_hash_table *)malloc(0x40);
    (conn->hh).tbl = pUVar6;
    if ((conn->hh).tbl == (UT_hash_table *)0x0) {
      exit(-1);
    }
    memset((conn->hh).tbl,0,0x40);
    ((conn->hh).tbl)->tail = &conn->hh;
    ((conn->hh).tbl)->num_buckets = 0x20;
    ((conn->hh).tbl)->log2_num_buckets = 5;
    ((conn->hh).tbl)->hho = 0x28;
    pUVar7 = (UT_hash_bucket *)malloc(0x200);
    ((conn->hh).tbl)->buckets = pUVar7;
    ((conn->hh).tbl)->signature = 0xa0111fe1;
    if (((conn->hh).tbl)->buckets == (UT_hash_bucket *)0x0) {
      exit(-1);
    }
    memset(((conn->hh).tbl)->buckets,0,0x200);
    ctx->connections = conn;
  }
  else {
    (conn->hh).tbl = (ctx->connections->hh).tbl;
    (conn->hh).next = (void *)0x0;
    (conn->hh).prev =
         (void *)((long)((ctx->connections->hh).tbl)->tail - ((ctx->connections->hh).tbl)->hho);
    ((ctx->connections->hh).tbl)->tail->next = conn;
    ((ctx->connections->hh).tbl)->tail = &conn->hh;
  }
  pUVar6 = (ctx->connections->hh).tbl;
  pUVar6->num_items = pUVar6->num_items + 1;
  pUVar7 = ((ctx->connections->hh).tbl)->buckets +
           (uVar3 & ((ctx->connections->hh).tbl)->num_buckets - 1);
  pUVar7->count = pUVar7->count + 1;
  (conn->hh).hh_next = pUVar7->hh_head;
  (conn->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar7->hh_head != (UT_hash_handle *)0x0) {
    pUVar7->hh_head->hh_prev = &conn->hh;
  }
  pUVar7->hh_head = &conn->hh;
  if (((pUVar7->expand_mult + 1) * 10 <= pUVar7->count) && (((conn->hh).tbl)->noexpand == 0)) {
    pUVar7 = (UT_hash_bucket *)malloc((ulong)((conn->hh).tbl)->num_buckets << 5);
    if (pUVar7 == (UT_hash_bucket *)0x0) {
      exit(-1);
    }
    memset(pUVar7,0,(ulong)((conn->hh).tbl)->num_buckets << 5);
    ((conn->hh).tbl)->ideal_chain_maxlen =
         (((conn->hh).tbl)->num_items >> ((char)((conn->hh).tbl)->log2_num_buckets + 1U & 0x1f)) +
         (uint)((((conn->hh).tbl)->num_items & ((conn->hh).tbl)->num_buckets * 2 - 1) != 0);
    ((conn->hh).tbl)->nonideal_items = 0;
    for (_he_thh._0_4_ = 0; (uint)_he_thh < ((conn->hh).tbl)->num_buckets;
        _he_thh._0_4_ = (uint)_he_thh + 1) {
      _he_hh_nxt = ((conn->hh).tbl)->buckets[(uint)_he_thh].hh_head;
      while (_he_hh_nxt != (UT_hash_handle *)0x0) {
        pUVar1 = _he_hh_nxt->hh_next;
        pUVar8 = pUVar7 + (_he_hh_nxt->hashv & ((conn->hh).tbl)->num_buckets * 2 - 1);
        uVar3 = pUVar8->count + 1;
        pUVar8->count = uVar3;
        if ((((conn->hh).tbl)->ideal_chain_maxlen < uVar3) &&
           (pUVar6 = (conn->hh).tbl, pUVar6->nonideal_items = pUVar6->nonideal_items + 1,
           pUVar8->expand_mult * ((conn->hh).tbl)->ideal_chain_maxlen < pUVar8->count)) {
          pUVar8->expand_mult = pUVar8->expand_mult + 1;
        }
        _he_hh_nxt->hh_prev = (UT_hash_handle *)0x0;
        _he_hh_nxt->hh_next = pUVar8->hh_head;
        if (pUVar8->hh_head != (UT_hash_handle *)0x0) {
          pUVar8->hh_head->hh_prev = _he_hh_nxt;
        }
        pUVar8->hh_head = _he_hh_nxt;
        _he_hh_nxt = pUVar1;
      }
    }
    free(((conn->hh).tbl)->buckets);
    pUVar6 = (conn->hh).tbl;
    pUVar6->num_buckets = pUVar6->num_buckets << 1;
    pUVar6 = (conn->hh).tbl;
    pUVar6->log2_num_buckets = pUVar6->log2_num_buckets + 1;
    ((conn->hh).tbl)->buckets = pUVar7;
    if (((conn->hh).tbl)->num_items >> 1 < ((conn->hh).tbl)->nonideal_items) {
      local_74 = ((conn->hh).tbl)->ineff_expands + 1;
    }
    else {
      local_74 = 0;
    }
    ((conn->hh).tbl)->ineff_expands = local_74;
    if (1 < ((conn->hh).tbl)->ineff_expands) {
      ((conn->hh).tbl)->noexpand = 1;
    }
  }
  return;
}

Assistant:

void chirc_ctx_add_connection(chirc_ctx_t *ctx, chirc_connection_t *conn)
{
    HASH_ADD_INT(ctx->connections, socket, conn);
}